

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_byte.hpp
# Opt level: O0

void __thiscall
ans_byte_encode::encode_symbol(ans_byte_encode *this,uint64_t *state,uint8_t sym,uint8_t **out_u8)

{
  reference pvVar1;
  long *in_RCX;
  ulong *in_RSI;
  size_type in_RDI;
  uint32_t *out_ptr_u32;
  value_type *e;
  array<enc_entry,_256UL> *in_stack_ffffffffffffffd0;
  
  pvVar1 = std::array<enc_entry,_256UL>::operator[](in_stack_ffffffffffffffd0,in_RDI);
  if (pvVar1->sym_upper_bound <= *in_RSI) {
    *(int *)*in_RCX = (int)*in_RSI;
    *in_RCX = *in_RCX + 4;
    *in_RSI = *in_RSI >> 0x20;
  }
  *in_RSI = (*in_RSI / (ulong)pvVar1->freq) * *(long *)(in_RDI + 0x1200) +
            *in_RSI % (ulong)pvVar1->freq + (ulong)pvVar1->base;
  return;
}

Assistant:

void encode_symbol(uint64_t& state, uint8_t sym, uint8_t*& out_u8)
    {
        const auto& e = table[sym];
        if (state >= e.sym_upper_bound) {
            auto out_ptr_u32 = reinterpret_cast<uint32_t*>(out_u8);
            *out_ptr_u32 = state & 0xFFFFFFFF;
            out_u8 += sizeof(uint32_t);
            state = state >> constants::RADIX_LOG2;
        }
        state = ((state / e.freq) * frame_size) + (state % e.freq) + e.base;
    }